

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::freeLinkedList
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this,Task *datain,
          Task *last_datain,bool no_dealloc)

{
  byte bVar1;
  bool bVar2;
  __pointer_type pTVar3;
  byte in_CL;
  long in_RDX;
  Task *in_RSI;
  __pointer_type in_RDI;
  Task *p;
  undefined8 in_stack_ffffffffffffffc0;
  memory_order mVar4;
  atomic<depspawn::internal::TaskPool::Task_*> *in_stack_ffffffffffffffc8;
  __pointer_type *in_stack_ffffffffffffffd8;
  Task *pTVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  mVar4 = (memory_order)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  bVar1 = in_CL & 1;
  if (bVar1 == 0) {
    *(undefined8 *)(in_RDX + 0x28) = 0;
    for (pTVar5 = in_RSI; mVar4 = (memory_order)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
        pTVar5 != (Task *)0x0; pTVar5 = pTVar5->next) {
      depspawn::internal::TaskPool::Task::~Task((Task *)0x130785);
    }
    in_stack_ffffffffffffffd8 = (__pointer_type *)0x0;
  }
  pTVar3 = std::atomic<depspawn::internal::TaskPool::Task_*>::load(in_stack_ffffffffffffffc8,mVar4);
  *(__pointer_type *)(in_RDX + 0x28) = pTVar3;
  do {
    mVar4 = (memory_order)((ulong)(in_RDX + 0x28) >> 0x20);
    next_ptr(in_RSI,*(Task **)(in_RDX + 0x28));
    bVar2 = std::atomic<depspawn::internal::TaskPool::Task_*>::compare_exchange_weak
                      ((atomic<depspawn::internal::TaskPool::Task_*> *)
                       CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,in_RDI,
                       mVar4);
  } while (((bVar2 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void freeLinkedList(T* const datain, T* const last_datain, const bool no_dealloc = false) noexcept(ALLOC_ONCE)
  {
    if (!ALLOC_ONCE && !no_dealloc) {
      last_datain->next = nullptr;
      for (T* p = datain; p != nullptr; p = static_cast<T *>(p->next)) {
        p->~T();
      }
    }

    last_datain->next = head_.load(std::memory_order_relaxed);
    while(!head_.compare_exchange_weak(reinterpret_cast<T*&>(last_datain->next), next_ptr(datain, static_cast<T *>(last_datain->next))));
  }